

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.c
# Opt level: O0

int pu(int u,int i,int f)

{
  char *pcVar1;
  size_t sVar2;
  uint in_EDX;
  int in_ESI;
  int in_EDI;
  int local_4;
  
  if (in_EDI < 1) {
    if (in_EDI < 0) {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    if ((in_EDX & 2) != 0) {
      pcVar1 = ucp + 1;
      *ucp = '-';
      ucp = pcVar1;
    }
    if (unames[in_ESI] == (char *)0x0) {
      sprintf(ucp,"*%c*",(ulong)(in_ESI + 0x61));
      sVar2 = strlen(ucp);
      ucp = ucp + sVar2;
    }
    else {
      sprintf(ucp,"%s",unames[in_ESI]);
      sVar2 = strlen(ucp);
      ucp = ucp + sVar2;
    }
    if (1 < in_EDI) {
      pcVar1 = ucp + 1;
      *ucp = (char)in_EDI + '0';
      ucp = pcVar1;
    }
    local_4 = 2;
  }
  return local_4;
}

Assistant:

static int pu(int u, int i, int f)
{

	if(u > 0) {
		if(f&2)
			*ucp++ = '-';
		if(unames[i]) {
			sprintf(ucp,"%s", unames[i]);
			ucp += strlen(ucp);
		} else{
			sprintf(ucp,"*%c*", i+'a');
			ucp += strlen(ucp);
		}
		if(u > 1)
			*ucp++ = (u+'0');
			return(2);
	}
	if(u < 0)
		return(1);
	return(0);
}